

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O1

int EncodeAlphaInternal(uint8_t *data,int width,int height,int method,int filter,int reduce_levels,
                       int effort_level,uint8_t *tmp_alpha,FilterTrial *result)

{
  VP8BitWriter *bw;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint8_t *data_00;
  byte bVar5;
  byte bVar6;
  uint8_t *puVar7;
  uint8_t *size;
  char cVar8;
  bool bVar9;
  VP8LBitWriter tmp_bw;
  WebPConfig config;
  VP8LBitWriter local_1d8;
  WebPConfig local_1a4;
  WebPPicture local_130;
  
  if (WebPFilters[filter] != (WebPFilterFunc)0x0) {
    (*WebPFilters[filter])(data,width,height,width,tmp_alpha);
    data = tmp_alpha;
  }
  puVar7 = (uint8_t *)(long)(height * width);
  bVar1 = true;
  if (method == 0) {
    bVar2 = false;
    cVar8 = '\0';
    data_00 = (uint8_t *)0x0;
    size = (uint8_t *)0x0;
LAB_00136430:
    if (bVar1) {
      size = puVar7;
      data_00 = data;
    }
    bVar5 = cVar8 + (char)filter * '\x04';
    bVar6 = bVar5 | 0x10;
    if (reduce_levels == 0) {
      bVar6 = bVar5;
    }
    local_130.use_argb = CONCAT31(local_130.use_argb._1_3_,bVar6);
    bw = &result->bw;
    iVar3 = VP8BitWriterInit(bw,(size_t)(size + 1));
    bVar9 = false;
    if (((bool)(bVar2 | bVar1)) && (bVar9 = false, iVar3 != 0)) {
      iVar3 = VP8BitWriterAppend(bw,(uint8_t *)&local_130,1);
      if (iVar3 == 0) {
        bVar9 = false;
      }
      else {
        iVar3 = VP8BitWriterAppend(bw,data_00,(size_t)size);
        bVar9 = iVar3 != 0;
      }
    }
    if (!bVar1) {
      VP8LBitWriterWipeOut(&local_1d8);
    }
    uVar4 = 0;
    if (bVar9) {
      uVar4 = (uint)((result->bw).error == 0);
    }
    result->score = (result->bw).pos;
  }
  else {
    iVar3 = VP8LBitWriterInit(&local_1d8,(ulong)puVar7 >> 3);
    if ((iVar3 == 0) || (iVar3 = WebPPictureInitInternal(&local_130,0x210), iVar3 == 0)) {
LAB_00136531:
      bVar2 = false;
    }
    else {
      local_130.stats = &result->stats;
      local_130.use_argb = 1;
      local_130.width = width;
      local_130.height = height;
      iVar3 = WebPPictureAlloc(&local_130);
      if (iVar3 == 0) goto LAB_00136531;
      (*WebPDispatchAlphaToGreen)
                (data,width,local_130.width,local_130.height,local_130.argb,local_130.argb_stride);
      bVar2 = false;
      iVar3 = WebPConfigInitInternal(&local_1a4,WEBP_PRESET_DEFAULT,75.0,0x210);
      if (iVar3 != 0) {
        local_1a4.lossless = 1;
        local_1a4.exact = 1;
        local_1a4.method = effort_level;
        if (effort_level == 6 && reduce_levels == 0) {
          local_1a4.quality = 100.0;
        }
        else {
          local_1a4.quality = (float)effort_level * 8.0;
        }
        iVar3 = VP8LEncodeStream(&local_1a4,&local_130,&local_1d8);
        WebPPictureFree(&local_130);
        if ((iVar3 == 0) || (bVar2 = true, local_1d8.error != 0)) {
          VP8LBitWriterWipeOut(&local_1d8);
          goto LAB_00136531;
        }
      }
    }
    if (bVar2) {
      data_00 = VP8LBitWriterFinish(&local_1d8);
      if (local_1d8.error == 0) {
        size = local_1d8.cur + ((long)(local_1d8.used + 7 >> 3) - (long)local_1d8.buf);
        cVar8 = '\0';
        if (puVar7 < size) {
          VP8LBitWriterWipeOut(&local_1d8);
          bVar1 = true;
        }
        else {
          cVar8 = '\x01';
          bVar1 = false;
        }
        goto LAB_00136430;
      }
      VP8LBitWriterWipeOut(&local_1d8);
      (result->bw).max_pos = 0;
      *(undefined8 *)&(result->bw).error = 0;
      (result->bw).buf = (uint8_t *)0x0;
      (result->bw).pos = 0;
      (result->bw).range = 0;
      (result->bw).value = 0;
      (result->bw).run = 0;
      (result->bw).nb_bits = 0;
    }
    else {
      VP8LBitWriterWipeOut(&local_1d8);
      (result->bw).max_pos = 0;
      *(undefined8 *)&(result->bw).error = 0;
      (result->bw).buf = (uint8_t *)0x0;
      (result->bw).pos = 0;
      (result->bw).range = 0;
      (result->bw).value = 0;
      (result->bw).run = 0;
      (result->bw).nb_bits = 0;
    }
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

static int EncodeAlphaInternal(const uint8_t* const data, int width, int height,
                               int method, int filter, int reduce_levels,
                               int effort_level,  // in [0..6] range
                               uint8_t* const tmp_alpha,
                               FilterTrial* result) {
  int ok = 0;
  const uint8_t* alpha_src;
  WebPFilterFunc filter_func;
  uint8_t header;
  const size_t data_size = width * height;
  const uint8_t* output = NULL;
  size_t output_size = 0;
  VP8LBitWriter tmp_bw;

  assert((uint64_t)data_size == (uint64_t)width * height);  // as per spec
  assert(filter >= 0 && filter < WEBP_FILTER_LAST);
  assert(method >= ALPHA_NO_COMPRESSION);
  assert(method <= ALPHA_LOSSLESS_COMPRESSION);
  assert(sizeof(header) == ALPHA_HEADER_LEN);

  filter_func = WebPFilters[filter];
  if (filter_func != NULL) {
    filter_func(data, width, height, width, tmp_alpha);
    alpha_src = tmp_alpha;
  }  else {
    alpha_src = data;
  }

  if (method != ALPHA_NO_COMPRESSION) {
    ok = VP8LBitWriterInit(&tmp_bw, data_size >> 3);
    ok = ok && EncodeLossless(alpha_src, width, height, effort_level,
                              !reduce_levels, &tmp_bw, &result->stats);
    if (ok) {
      output = VP8LBitWriterFinish(&tmp_bw);
      if (tmp_bw.error) {
        VP8LBitWriterWipeOut(&tmp_bw);
        memset(&result->bw, 0, sizeof(result->bw));
        return 0;
      }
      output_size = VP8LBitWriterNumBytes(&tmp_bw);
      if (output_size > data_size) {
        // compressed size is larger than source! Revert to uncompressed mode.
        method = ALPHA_NO_COMPRESSION;
        VP8LBitWriterWipeOut(&tmp_bw);
      }
    } else {
      VP8LBitWriterWipeOut(&tmp_bw);
      memset(&result->bw, 0, sizeof(result->bw));
      return 0;
    }
  }

  if (method == ALPHA_NO_COMPRESSION) {
    output = alpha_src;
    output_size = data_size;
    ok = 1;
  }

  // Emit final result.
  header = method | (filter << 2);
  if (reduce_levels) header |= ALPHA_PREPROCESSED_LEVELS << 4;

  if (!VP8BitWriterInit(&result->bw, ALPHA_HEADER_LEN + output_size)) ok = 0;
  ok = ok && VP8BitWriterAppend(&result->bw, &header, ALPHA_HEADER_LEN);
  ok = ok && VP8BitWriterAppend(&result->bw, output, output_size);

  if (method != ALPHA_NO_COMPRESSION) {
    VP8LBitWriterWipeOut(&tmp_bw);
  }
  ok = ok && !result->bw.error;
  result->score = VP8BitWriterSize(&result->bw);
  return ok;
}